

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

void __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<(anonymous_namespace)::CMakeVersion>::Object
          (Object<(anonymous_namespace)::CMakeVersion> *this,
          Object<(anonymous_namespace)::CMakeVersion> *param_1)

{
  pointer pMVar1;
  _Manager_type p_Var2;
  undefined8 uVar3;
  char *pcVar4;
  undefined3 uVar5;
  ReadFileResult RVar6;
  pointer pMVar7;
  long lVar8;
  pointer pMVar9;
  
  lVar8 = (long)(param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar7 = std::
           _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
           ::_M_allocate((_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                          *)((lVar8 >> 3) * 0x6db6db6db6db6db7),(size_t)param_1);
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = pMVar7;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar7;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar8 + (long)pMVar7);
  pMVar1 = (param_1->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar9 = (param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar9 != pMVar1; pMVar9 = pMVar9 + 1) {
    pcVar4 = (pMVar9->Name)._M_str;
    (pMVar7->Name)._M_len = (pMVar9->Name)._M_len;
    (pMVar7->Name)._M_str = pcVar4;
    *(undefined8 *)&(pMVar7->Function).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pMVar7->Function).super__Function_base._M_functor + 8) = 0;
    (pMVar7->Function).super__Function_base._M_manager = (_Manager_type)0x0;
    (pMVar7->Function)._M_invoker = (_Invoker_type)0x0;
    p_Var2 = (pMVar9->Function).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&pMVar7->Function,(_Any_data *)&pMVar9->Function,__clone_functor);
      (pMVar7->Function)._M_invoker = (pMVar9->Function)._M_invoker;
      (pMVar7->Function).super__Function_base._M_manager =
           (pMVar9->Function).super__Function_base._M_manager;
    }
    pMVar7->Required = pMVar9->Required;
    pMVar7 = pMVar7 + 1;
  }
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar7;
  uVar5 = *(undefined3 *)&param_1->field_0x19;
  RVar6 = param_1->Success;
  uVar3 = *(undefined8 *)((long)&param_1->Success + 1);
  this->AnyRequired = param_1->AnyRequired;
  *(undefined3 *)&this->field_0x19 = uVar5;
  this->Success = RVar6;
  *(undefined8 *)((long)&this->Success + 1) = uVar3;
  return;
}

Assistant:

Object(E&& success, E&& fail, bool allowExtra = true)
      : Success(std::move(success))
      , Fail(std::move(fail))
      , AllowExtra(allowExtra)
    {
    }